

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_FeatureTypes_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_007919b0 == '\x01') {
    DAT_007919b0 = '\0';
    (*(code *)*_Int64FeatureType_default_instance_)();
  }
  if (DAT_007919d0 == '\x01') {
    DAT_007919d0 = '\0';
    (*(code *)*_DoubleFeatureType_default_instance_)();
  }
  if (DAT_007919f0 == '\x01') {
    DAT_007919f0 = '\0';
    (*(code *)*_StringFeatureType_default_instance_)();
  }
  if (DAT_00791a20 == '\x01') {
    DAT_00791a20 = '\0';
    (*(code *)*_SizeRange_default_instance_)();
  }
  if (DAT_00791a50 == '\x01') {
    DAT_00791a50 = '\0';
    (*(code *)*_ImageFeatureType_ImageSize_default_instance_)();
  }
  if (DAT_00791a88 == '\x01') {
    DAT_00791a88 = '\0';
    (*(code *)*_ImageFeatureType_EnumeratedImageSizes_default_instance_)();
  }
  if (DAT_00791ab8 == '\x01') {
    DAT_00791ab8 = '\0';
    (*(code *)*_ImageFeatureType_ImageSizeRange_default_instance_)();
  }
  if (DAT_00791af8 == '\x01') {
    DAT_00791af8 = '\0';
    (*(code *)*_ImageFeatureType_default_instance_)();
  }
  if (DAT_00791b38 == '\x01') {
    DAT_00791b38 = '\0';
    (*(code *)*_ArrayFeatureType_Shape_default_instance_)();
  }
  if (DAT_00791b70 == '\x01') {
    DAT_00791b70 = '\0';
    (*(code *)*_ArrayFeatureType_EnumeratedShapes_default_instance_)();
  }
  if (DAT_00791ba8 == '\x01') {
    DAT_00791ba8 = '\0';
    (*(code *)*_ArrayFeatureType_ShapeRange_default_instance_)();
  }
  if (DAT_00791bf8 == '\x01') {
    DAT_00791bf8 = '\0';
    (*(code *)*_ArrayFeatureType_default_instance_)();
  }
  if (DAT_00791c40 == '\x01') {
    DAT_00791c40 = '\0';
    (*(code *)*_DictionaryFeatureType_default_instance_)();
  }
  if (DAT_00791c80 == '\x01') {
    DAT_00791c80 = '\0';
    (*(code *)*_SequenceFeatureType_default_instance_)();
  }
  if (DAT_00791cc0 == '\x01') {
    DAT_00791cc0 = 0;
    (*(code *)*_FeatureType_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Int64FeatureType_default_instance_.Shutdown();
  _DoubleFeatureType_default_instance_.Shutdown();
  _StringFeatureType_default_instance_.Shutdown();
  _SizeRange_default_instance_.Shutdown();
  _ImageFeatureType_ImageSize_default_instance_.Shutdown();
  _ImageFeatureType_EnumeratedImageSizes_default_instance_.Shutdown();
  _ImageFeatureType_ImageSizeRange_default_instance_.Shutdown();
  _ImageFeatureType_default_instance_.Shutdown();
  _ArrayFeatureType_Shape_default_instance_.Shutdown();
  _ArrayFeatureType_EnumeratedShapes_default_instance_.Shutdown();
  _ArrayFeatureType_ShapeRange_default_instance_.Shutdown();
  _ArrayFeatureType_default_instance_.Shutdown();
  _DictionaryFeatureType_default_instance_.Shutdown();
  _SequenceFeatureType_default_instance_.Shutdown();
  _FeatureType_default_instance_.Shutdown();
}